

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O0

void __thiscall Opcode::AABBCollisionTree::~AABBCollisionTree(AABBCollisionTree *this)

{
  AABBCollisionTree *this_local;
  
  ~AABBCollisionTree(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

AABBCollisionTree::~AABBCollisionTree()
{
	DELETEARRAY(mNodes);
}